

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O3

CK_RV __thiscall
SoftHSM::C_DecryptFinal
          (SoftHSM *this,CK_SESSION_HANDLE hSession,CK_BYTE_PTR pData,CK_ULONG_PTR pDataLen)

{
  CK_ULONG CVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  Session *this_00;
  SymmetricAlgorithm *pSVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_t sVar6;
  size_t sVar7;
  uchar *__src;
  CK_RV CVar8;
  ulong uVar9;
  ByteString local_58;
  
  CVar8 = 400;
  if (this->isInitialised == true) {
    this_00 = (Session *)HandleManager::getSession(this->handleManager,hSession);
    if (this_00 == (Session *)0x0) {
      CVar8 = 0xb3;
    }
    else if (pDataLen == (CK_ULONG_PTR)0x0) {
      Session::resetOp(this_00);
      CVar8 = 7;
    }
    else {
      iVar3 = Session::getOpType(this_00);
      CVar8 = 0x91;
      if (iVar3 == 3) {
        pSVar5 = Session::getSymmetricCryptoOp(this_00);
        if (pSVar5 == (SymmetricAlgorithm *)0x0) {
          CVar8 = 0x54;
        }
        else {
          pSVar5 = Session::getSymmetricCryptoOp(this_00);
          if ((pSVar5 != (SymmetricAlgorithm *)0x0) &&
             (bVar2 = Session::getAllowMultiPartOp(this_00), bVar2)) {
            iVar3 = (*pSVar5->_vptr_SymmetricAlgorithm[0x10])(pSVar5);
            uVar9 = CONCAT44(extraout_var,iVar3);
            iVar3 = (*pSVar5->_vptr_SymmetricAlgorithm[0x13])(pSVar5);
            if ((char)iVar3 != '\0') {
              iVar3 = (*pSVar5->_vptr_SymmetricAlgorithm[0xd])(pSVar5);
              if (uVar9 % CONCAT44(extraout_var_00,iVar3) != 0) {
                Session::resetOp(this_00);
                softHSMLog(7,"SymDecryptFinal",
                           "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                           ,0xde0,
                           "Remaining data length is not an integral of the block size. Block size: %#2x  Remaining size: %#2x"
                           ,CONCAT44(extraout_var_00,iVar3),uVar9);
                return 0x41;
              }
              uVar4 = (*pSVar5->_vptr_SymmetricAlgorithm[0xf])(pSVar5);
              uVar9 = uVar9 - (uVar4 & 0xff);
            }
            if (pData != (CK_BYTE_PTR)0x0) {
              if (*pDataLen < uVar9) {
                softHSMLog(7,"SymDecryptFinal",
                           "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                           ,0xdf3,"output buffer size: %#5x  size: %#5x",*pDataLen,uVar9);
                *pDataLen = uVar9;
                return 0x150;
              }
              ByteString::ByteString(&local_58);
              iVar3 = (*pSVar5->_vptr_SymmetricAlgorithm[7])(pSVar5,&local_58);
              if ((char)iVar3 == '\0') {
                CVar8 = 0x40;
                Session::resetOp(this_00);
              }
              else {
                CVar1 = *pDataLen;
                sVar6 = ByteString::size(&local_58);
                softHSMLog(7,"SymDecryptFinal",
                           "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                           ,0xe00,
                           "output buffer size: %#2x  size: %#2x  decryptedFinal.size(): %#2x",CVar1
                           ,uVar9,sVar6);
                uVar9 = *pDataLen;
                sVar7 = ByteString::size(&local_58);
                if (uVar9 < sVar7) {
                  Session::resetOp(this_00);
                  CVar1 = *pDataLen;
                  sVar7 = ByteString::size(&local_58);
                  CVar8 = 0x41;
                  softHSMLog(3,"SymDecryptFinal",
                             "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                             ,0xe07,
                             "DecryptFinal returning too much data. Length of output data buffer is %i but %i bytes was returned by the encrypt."
                             ,CVar1,sVar7,sVar6);
                }
                else {
                  sVar6 = ByteString::size(&local_58);
                  if (sVar6 != 0) {
                    __src = ByteString::byte_str(&local_58);
                    sVar6 = ByteString::size(&local_58);
                    memcpy(pData,__src,sVar6);
                  }
                  sVar6 = ByteString::size(&local_58);
                  *pDataLen = sVar6;
                  Session::resetOp(this_00);
                  CVar8 = 0;
                }
              }
              local_58._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
              std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                        (&local_58.byteString.
                          super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
              return CVar8;
            }
            *pDataLen = uVar9;
            return 0;
          }
          Session::resetOp(this_00);
        }
      }
    }
  }
  return CVar8;
}

Assistant:

CK_RV SoftHSM::C_DecryptFinal(CK_SESSION_HANDLE hSession, CK_BYTE_PTR pData, CK_ULONG_PTR pDataLen)
{
	if (!isInitialised) return CKR_CRYPTOKI_NOT_INITIALIZED;

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL) return CKR_SESSION_HANDLE_INVALID;

	// Github issue #469, check NULL_PTR on pDataLen
	if (pDataLen == NULL)
	{
		session->resetOp();
		return CKR_ARGUMENTS_BAD;
	}

	// Check if we are doing the correct operation
	if (session->getOpType() != SESSION_OP_DECRYPT) return CKR_OPERATION_NOT_INITIALIZED;

	if (session->getSymmetricCryptoOp() != NULL)
		return SymDecryptFinal(session, pData, pDataLen);
	else
		return CKR_FUNCTION_NOT_SUPPORTED;
}